

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

void __thiscall
spvtools::opt::Instruction::ToBinaryWithoutAttachedDebugInsts
          (Instruction *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *binary)

{
  iterator __position;
  pointer pOVar1;
  pointer pOVar2;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var3;
  long *plVar4;
  uint32_t uVar5;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  _Var6;
  uint uVar7;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var8;
  uint local_1c;
  
  uVar5 = NumInOperandWords(this);
  uVar7 = (this->has_result_id_ & 1) + 1;
  if (this->has_type_id_ == false) {
    uVar7 = (uint)this->has_result_id_;
  }
  local_1c = (uint)(ushort)(short)this->opcode_ + (uVar7 + uVar5) * 0x10000 + 0x10000;
  __position._M_current =
       (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (binary,__position,&local_1c);
  }
  else {
    *__position._M_current = local_1c;
    (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  pOVar1 = (this->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar2 = (this->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pOVar1 != pOVar2) {
    _Var8._M_head_impl =
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&(pOVar1->words).small_data_;
    do {
      _Var3._M_head_impl =
           *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
            &((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)((long)_Var8._M_head_impl + 8))->_M_t;
      if ((__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )_Var3._M_head_impl ==
          (__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )0x0) {
        _Var6._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(*(long *)((long)_Var8._M_head_impl + -0x10) * 4 +
                         *(long *)_Var8._M_head_impl);
        _Var3._M_head_impl = _Var8._M_head_impl;
      }
      else {
        _Var6._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = *(tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)&((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)((long)_Var3._M_head_impl + 8))->_M_t;
      }
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_insert<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)binary,
                 (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 *(uint **)&((_Var3._M_head_impl)->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 ,_Var6._M_t.
                  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                  ._M_head_impl);
      plVar4 = (long *)((long)_Var8._M_head_impl + 0x10);
      _Var8._M_head_impl =
           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)_Var8._M_head_impl + 0x30);
    } while ((pointer)plVar4 != pOVar2);
  }
  return;
}

Assistant:

void Instruction::ToBinaryWithoutAttachedDebugInsts(
    std::vector<uint32_t>* binary) const {
  const uint32_t num_words = 1 + NumOperandWords();
  binary->push_back((num_words << 16) | static_cast<uint16_t>(opcode_));
  for (const auto& operand : operands_) {
    binary->insert(binary->end(), operand.words.begin(), operand.words.end());
  }
}